

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall
CMU462::Matrix3x3::operator*(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,Matrix3x3 *B)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  undefined4 local_34;
  undefined4 local_30;
  int k;
  int j;
  int i;
  Matrix3x3 *A;
  Matrix3x3 *B_local;
  Matrix3x3 *this_local;
  Matrix3x3 *C;
  
  Matrix3x3(__return_storage_ptr__);
  for (k = 0; k < 3; k = k + 1) {
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pdVar3 = operator()(__return_storage_ptr__,k,local_30);
      *pdVar3 = 0.0;
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        pdVar3 = operator()(this,k,local_34);
        dVar1 = *pdVar3;
        pdVar3 = operator()(B,local_34,local_30);
        dVar2 = *pdVar3;
        pdVar3 = operator()(__return_storage_ptr__,k,local_30);
        *pdVar3 = dVar1 * dVar2 + *pdVar3;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( const Matrix3x3& B ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 C;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       C(i,j) = 0.;

       for( int k = 0; k < 3; k++ )
       {
          C(i,j) += A(i,k)*B(k,j);
       }
    }

    return C;
  }